

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O2

shared_ptr<chaiscript::Boxed_Value::Data>
chaiscript::Boxed_Value::Object_Data::get<chaiscript::dispatch::Dynamic_Object>
          (Dynamic_Object *t,bool t_return_value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar1;
  element_type *ptr;
  shared_ptr<chaiscript::dispatch::Dynamic_Object> p;
  undefined1 local_49;
  _Head_base<0UL,_chaiscript::detail::Any::Data_*,_false> local_48;
  pointer local_40;
  undefined1 local_38 [16];
  Any local_28;
  pointer_____offset_0x10___ *local_20;
  undefined4 local_18;
  
  std::make_shared<chaiscript::dispatch::Dynamic_Object,chaiscript::dispatch::Dynamic_Object>
            ((Dynamic_Object *)local_38);
  local_40 = (pointer)local_38._0_8_;
  local_28.m_data._M_t.
  super___uniq_ptr_impl<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>_>
  ._M_t.
  super__Tuple_impl<0UL,_chaiscript::detail::Any::Data_*,_std::default_delete<chaiscript::detail::Any::Data>_>
  .super__Head_base<0UL,_chaiscript::detail::Any::Data_*,_false>._M_head_impl =
       (unique_ptr<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>_>
        )&chaiscript::dispatch::Dynamic_Object::typeinfo;
  local_20 = &chaiscript::dispatch::Dynamic_Object::typeinfo;
  local_18._0_1_ = false;
  local_18._1_3_ = 0;
  detail::Any::Any<std::shared_ptr<chaiscript::dispatch::Dynamic_Object>,void>
            ((Any *)&local_48,(shared_ptr<chaiscript::dispatch::Dynamic_Object> *)local_38);
  local_49 = 0;
  std::
  make_shared<chaiscript::Boxed_Value::Data,chaiscript::Type_Info,chaiscript::detail::Any,bool,chaiscript::dispatch::Dynamic_Object*&,bool&>
            ((Type_Info *)t,&local_28,(bool *)&local_48,(Dynamic_Object **)&local_49,
             (bool *)&local_40);
  if (local_48._M_head_impl != (Data *)0x0) {
    (*(local_48._M_head_impl)->_vptr_Data[1])();
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8));
  sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)t;
  return (shared_ptr<chaiscript::Boxed_Value::Data>)
         sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<Data> get(T t, bool t_return_value)
          {
            auto p = std::make_shared<T>(std::move(t));
            auto ptr = p.get();
            return std::make_shared<Data>(
                  detail::Get_Type_Info<T>::get(), 
                  chaiscript::detail::Any(std::move(p)),
                  false,
                  ptr,
                  t_return_value
                );
          }